

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4f>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,matrix4f *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  pointer pSVar4;
  pointer pSVar5;
  optional<tinyusdz::value::matrix4f> local_f4 [3];
  
  if (v == (matrix4f *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_value<tinyusdz::value::matrix4f>(local_f4,this);
    if (local_f4[0].has_value_ == true) goto LAB_0037bc22;
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar4 == pSVar5) {
      return false;
    }
  }
  else {
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar5 != pSVar4) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::matrix4f,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if ((((this->_blocked == false) &&
       (pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
      ((uVar3 = (*pvVar1->type_id)(), uVar3 == 0 ||
       ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
        (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))))) ||
     (get_value<tinyusdz::value::matrix4f>(local_f4,this), local_f4[0].has_value_ == false)) {
    return false;
  }
LAB_0037bc22:
  *(undefined8 *)v->m[3] = local_f4[0].contained._48_8_;
  *(undefined8 *)(v->m[3] + 2) = local_f4[0].contained._56_8_;
  *(undefined8 *)v->m[2] = local_f4[0].contained._32_8_;
  *(undefined8 *)(v->m[2] + 2) = local_f4[0].contained._40_8_;
  *(undefined8 *)v->m[1] = local_f4[0].contained._16_8_;
  *(undefined8 *)(v->m[1] + 2) = local_f4[0].contained._24_8_;
  *(undefined8 *)v->m[0] = local_f4[0].contained._0_8_;
  *(undefined8 *)(v->m[0] + 2) = local_f4[0].contained._8_8_;
  return true;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }